

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.hpp
# Opt level: O0

enable_if_t<is_std_basic_string<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_> *
toml::detail::string_conv<std::__cxx11::string,5ul>(char (*s) [5])

{
  enable_if_t<is_std_basic_string<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
  *in_RDI;
  char (*in_stack_00000018) [5];
  
  string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
  ::invoke<5ul>(in_stack_00000018);
  return in_RDI;
}

Assistant:

cxx::enable_if_t<is_std_basic_string<S>::value, S>
string_conv(const char (&s)[N])
{
    using C = typename S::value_type;
    using T = typename S::traits_type;
    using A = typename S::allocator_type;
    using C2 = char;
    using T2 = std::char_traits<C2>;
    using A2 = std::allocator<C2>;

    return string_conv_impl<C, T, A, C2, T2, A2>::template invoke<N>(s);
}